

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rel_ops.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_30a6::flexfloatRelOpsTest_Equal_Test::flexfloatRelOpsTest_Equal_Test
          (flexfloatRelOpsTest_Equal_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_00172a00;
  return;
}

Assistant:

TEST(flexfloatRelOpsTest, Equal)
{
    using doubleff = flexfloat<11, 52>;
    using floatff  = flexfloat<8, 23>;
    const double val1 = 1.0 + 1e-15;
    const double val2 = 1.0 + 2e-15;
    #ifndef FLEXFLOAT_ON_SINGLE
    EXPECT_TRUE(doubleff(val1) == doubleff(val1));
    EXPECT_FALSE(doubleff(val1) == doubleff(val2));
    #endif
    EXPECT_TRUE(floatff(val1) == floatff(val1));

    EXPECT_TRUE(floatff(val1) == floatff(val2));    // due to rounding
    #ifndef FLEXFLOAT_ON_SINGLE
    EXPECT_FALSE(doubleff(floatff(val1)) == doubleff(val1));  // due to rounding
    EXPECT_FALSE(doubleff(floatff(val1)) == doubleff(val2));  // due to rounding
    #endif
}